

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O0

int __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::access
          (SignalTimeDependent<double,_int> *this,char *__name,int __type)

{
  bool bVar1;
  double *pdVar2;
  int __type_00;
  double *Tres;
  bool up;
  int *t1_local;
  SignalTimeDependent<double,_int> *this_local;
  
  bVar1 = TimeDependency<int>::needUpdate(&this->super_TimeDependency<int>,(int *)__name);
  if (bVar1) {
    (this->super_TimeDependency<int>).lastAskForUpdate = 0;
    this_local._0_4_ =
         Signal<double,_int>::access
                   ((Signal<double,_int> *)
                    ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
                    (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]),__name,
                    __type_00);
    SignalBase<int>::setReady
              ((SignalBase<int> *)
               ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
               (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]),false);
  }
  else {
    pdVar2 = Signal<double,_int>::accessCopy
                       ((Signal<double,_int> *)
                        ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
                        (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]));
    this_local._0_4_ = (int)pdVar2;
  }
  return (int)this_local;
}

Assistant:

const T &SignalTimeDependent<T, Time>::access(const Time &t1) {
  const bool up = TimeDependency<Time>::needUpdate(t1);
  // SignalBase<Time>::setReady(false);

  /*       std::cout << "Time before: "<< signalTime << " -- "   */
  /*            << t1<< "  -> Up: "<<up <<std::endl ;   */
  if (up) {
    TimeDependency<Time>::lastAskForUpdate = false;
    const T &Tres = Signal<T, Time>::access(t1);
    SignalBase<Time>::setReady(false);
    return Tres;
  } else {
    return Signal<T, Time>::accessCopy();
  }
}